

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,SQLStatement *statement)

{
  SelectStatement *stmt;
  CopyDatabaseStatement *stmt_00;
  DropStatement *stmt_01;
  LogicalPlanStatement *stmt_02;
  CopyStatement *stmt_03;
  ExtensionStatement *stmt_04;
  ExportStatement *stmt_05;
  ExplainStatement *stmt_06;
  TransactionStatement *stmt_07;
  PragmaStatement *stmt_08;
  LoadStatement *stmt_09;
  AttachStatement *stmt_10;
  VacuumStatement *stmt_11;
  SetStatement *stmt_12;
  DeleteStatement *statement_00;
  CallStatement *stmt_13;
  PrepareStatement *stmt_14;
  UpdateStatement *statement_01;
  AlterStatement *stmt_15;
  CreateStatement *stmt_16;
  InsertStatement *statement_02;
  ExecuteStatement *stmt_17;
  RelationStatement *stmt_18;
  UpdateExtensionsStatement *stmt_19;
  DetachStatement *stmt_20;
  NotImplementedException *this_00;
  StatementType type;
  allocator local_61;
  string local_60;
  string local_40;
  
  (this->root_statement).ptr = statement;
  switch(statement->type) {
  case SELECT_STATEMENT:
    stmt = SQLStatement::Cast<duckdb::SelectStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt);
    break;
  case INSERT_STATEMENT:
    statement_02 = SQLStatement::Cast<duckdb::InsertStatement>(statement);
    BindWithCTE<duckdb::InsertStatement>(__return_storage_ptr__,this,statement_02);
    break;
  case UPDATE_STATEMENT:
    statement_01 = SQLStatement::Cast<duckdb::UpdateStatement>(statement);
    BindWithCTE<duckdb::UpdateStatement>(__return_storage_ptr__,this,statement_01);
    break;
  case CREATE_STATEMENT:
    stmt_16 = SQLStatement::Cast<duckdb::CreateStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_16);
    break;
  case DELETE_STATEMENT:
    statement_00 = SQLStatement::Cast<duckdb::DeleteStatement>(statement);
    BindWithCTE<duckdb::DeleteStatement>(__return_storage_ptr__,this,statement_00);
    break;
  case PREPARE_STATEMENT:
    stmt_14 = SQLStatement::Cast<duckdb::PrepareStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_14);
    break;
  case EXECUTE_STATEMENT:
    stmt_17 = SQLStatement::Cast<duckdb::ExecuteStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_17);
    break;
  case ALTER_STATEMENT:
    stmt_15 = SQLStatement::Cast<duckdb::AlterStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_15);
    break;
  case TRANSACTION_STATEMENT:
    stmt_07 = SQLStatement::Cast<duckdb::TransactionStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_07);
    break;
  case COPY_STATEMENT:
    stmt_03 = SQLStatement::Cast<duckdb::CopyStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_03,COPY_TO_FILE);
    break;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"Unimplemented statement type \"%s\" for Bind",&local_61);
    StatementTypeToString_abi_cxx11_(&local_60,(duckdb *)(ulong)statement->type,type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,&local_40,&local_60);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case EXPLAIN_STATEMENT:
    stmt_06 = SQLStatement::Cast<duckdb::ExplainStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_06);
    break;
  case DROP_STATEMENT:
    stmt_01 = SQLStatement::Cast<duckdb::DropStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_01);
    break;
  case EXPORT_STATEMENT:
    stmt_05 = SQLStatement::Cast<duckdb::ExportStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_05);
    break;
  case PRAGMA_STATEMENT:
    stmt_08 = SQLStatement::Cast<duckdb::PragmaStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_08);
    break;
  case VACUUM_STATEMENT:
    stmt_11 = SQLStatement::Cast<duckdb::VacuumStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_11);
    break;
  case CALL_STATEMENT:
    stmt_13 = SQLStatement::Cast<duckdb::CallStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_13);
    break;
  case SET_STATEMENT:
    stmt_12 = SQLStatement::Cast<duckdb::SetStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_12);
    break;
  case LOAD_STATEMENT:
    stmt_09 = SQLStatement::Cast<duckdb::LoadStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_09);
    break;
  case RELATION_STATEMENT:
    stmt_18 = SQLStatement::Cast<duckdb::RelationStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_18);
    break;
  case EXTENSION_STATEMENT:
    stmt_04 = SQLStatement::Cast<duckdb::ExtensionStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_04);
    break;
  case LOGICAL_PLAN_STATEMENT:
    stmt_02 = SQLStatement::Cast<duckdb::LogicalPlanStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_02);
    break;
  case ATTACH_STATEMENT:
    stmt_10 = SQLStatement::Cast<duckdb::AttachStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_10);
    break;
  case DETACH_STATEMENT:
    stmt_20 = SQLStatement::Cast<duckdb::DetachStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_20);
    break;
  case COPY_DATABASE_STATEMENT:
    stmt_00 = SQLStatement::Cast<duckdb::CopyDatabaseStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_00);
    break;
  case UPDATE_EXTENSIONS_STATEMENT:
    stmt_19 = SQLStatement::Cast<duckdb::UpdateExtensionsStatement>(statement);
    Bind(__return_storage_ptr__,this,stmt_19);
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(SQLStatement &statement) {
	root_statement = &statement;
	switch (statement.type) {
	case StatementType::SELECT_STATEMENT:
		return Bind(statement.Cast<SelectStatement>());
	case StatementType::INSERT_STATEMENT:
		return BindWithCTE(statement.Cast<InsertStatement>());
	case StatementType::COPY_STATEMENT:
		return Bind(statement.Cast<CopyStatement>(), CopyToType::COPY_TO_FILE);
	case StatementType::DELETE_STATEMENT:
		return BindWithCTE(statement.Cast<DeleteStatement>());
	case StatementType::UPDATE_STATEMENT:
		return BindWithCTE(statement.Cast<UpdateStatement>());
	case StatementType::RELATION_STATEMENT:
		return Bind(statement.Cast<RelationStatement>());
	case StatementType::CREATE_STATEMENT:
		return Bind(statement.Cast<CreateStatement>());
	case StatementType::DROP_STATEMENT:
		return Bind(statement.Cast<DropStatement>());
	case StatementType::ALTER_STATEMENT:
		return Bind(statement.Cast<AlterStatement>());
	case StatementType::TRANSACTION_STATEMENT:
		return Bind(statement.Cast<TransactionStatement>());
	case StatementType::PRAGMA_STATEMENT:
		return Bind(statement.Cast<PragmaStatement>());
	case StatementType::EXPLAIN_STATEMENT:
		return Bind(statement.Cast<ExplainStatement>());
	case StatementType::VACUUM_STATEMENT:
		return Bind(statement.Cast<VacuumStatement>());
	case StatementType::CALL_STATEMENT:
		return Bind(statement.Cast<CallStatement>());
	case StatementType::EXPORT_STATEMENT:
		return Bind(statement.Cast<ExportStatement>());
	case StatementType::SET_STATEMENT:
		return Bind(statement.Cast<SetStatement>());
	case StatementType::LOAD_STATEMENT:
		return Bind(statement.Cast<LoadStatement>());
	case StatementType::EXTENSION_STATEMENT:
		return Bind(statement.Cast<ExtensionStatement>());
	case StatementType::PREPARE_STATEMENT:
		return Bind(statement.Cast<PrepareStatement>());
	case StatementType::EXECUTE_STATEMENT:
		return Bind(statement.Cast<ExecuteStatement>());
	case StatementType::LOGICAL_PLAN_STATEMENT:
		return Bind(statement.Cast<LogicalPlanStatement>());
	case StatementType::ATTACH_STATEMENT:
		return Bind(statement.Cast<AttachStatement>());
	case StatementType::DETACH_STATEMENT:
		return Bind(statement.Cast<DetachStatement>());
	case StatementType::COPY_DATABASE_STATEMENT:
		return Bind(statement.Cast<CopyDatabaseStatement>());
	case StatementType::UPDATE_EXTENSIONS_STATEMENT:
		return Bind(statement.Cast<UpdateExtensionsStatement>());
	default: // LCOV_EXCL_START
		throw NotImplementedException("Unimplemented statement type \"%s\" for Bind",
		                              StatementTypeToString(statement.type));
	} // LCOV_EXCL_STOP
}